

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobalObject.cpp
# Opt level: O0

Var Js::GlobalObject::EntryUnEscape(RecyclableObject *function,CallInfo callInfo,...)

{
  char16 cVar1;
  code *pcVar2;
  bool bVar3;
  ushort uVar4;
  int n;
  CallFlags e;
  charcount_t cVar5;
  ScriptContext *pSVar6;
  ThreadContext *this;
  Var *values;
  undefined4 *puVar7;
  JavascriptLibrary *pJVar8;
  Var aValue;
  char16 *pcVar9;
  CompoundString *pCVar10;
  JavascriptString *local_80;
  JavascriptString *src;
  CompoundString *bs;
  char16 *pchMin;
  char16 *pchLim;
  char16 *pchSrc;
  char16 chT;
  ScriptContext *pSStack_50;
  char16 chw;
  ScriptContext *scriptContext;
  ArgumentReader args;
  Var *_argsVarArray;
  RecyclableObject *function_local;
  CallInfo callInfo_local;
  
  function_local = (RecyclableObject *)callInfo;
  pSVar6 = RecyclableObject::GetScriptContext(function);
  this = ScriptContext::GetThreadContext(pSVar6);
  pSVar6 = RecyclableObject::GetScriptContext(function);
  ThreadContext::ProbeStack(this,0xc00,pSVar6,(PVOID)0x0);
  n = _count_args((CallInfo)function_local);
  values = _get_va(&stack0x00000000,n);
  args.super_Arguments.Values = (Type)function_local;
  bVar3 = CallInfo::operator==((CallInfo *)(values + -1),(CallInfo)function_local);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/GlobalObject.cpp"
                                ,0x59e,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  ArgumentReader::ArgumentReader
            ((ArgumentReader *)&scriptContext,(CallInfo *)&function_local,values);
  pSStack_50 = RecyclableObject::GetScriptContext(function);
  e = Js::operator&((CallFlags)((ulong)function_local >> 0x18) &
                    (CallFlags_InternalFrame|CallFlags_NewTarget|CallFlags_Wrapped|CallFlags_NotUsed
                     |CallFlags_ExtraArg|CallFlags_Eval|CallFlags_Value|CallFlags_New),CallFlags_New
                   );
  bVar3 = operator!(e);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/GlobalObject.cpp"
                                ,0x5a1,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  if (((uint)scriptContext & 0xffffff) == 1 || ((ulong)scriptContext & 0xffffff) == 0) {
    pJVar8 = ScriptContext::GetLibrary(pSStack_50);
    callInfo_local = (CallInfo)JavascriptLibrary::GetUndefinedDisplayString(pJVar8);
  }
  else {
    src = (JavascriptString *)0x0;
    EnterPinnedScope(&local_80);
    aValue = Arguments::operator[]((Arguments *)&scriptContext,1);
    local_80 = JavascriptConversion::ToString(aValue,pSStack_50);
    cVar5 = JavascriptString::GetLength(local_80);
    pJVar8 = ScriptContext::GetLibrary(pSStack_50);
    src = (JavascriptString *)CompoundString::NewWithCharCapacity(cVar5,pJVar8);
    pcVar9 = JavascriptString::GetString(local_80);
    pchLim = pcVar9;
    cVar5 = JavascriptString::GetLength(local_80);
    pchMin = pcVar9 + cVar5;
    while (pchLim < pchMin) {
      pCVar10 = (CompoundString *)(pchLim + 1);
      pchSrc._4_2_ = *pchLim;
      if (pchSrc._4_2_ == L'%') {
        pchSrc._4_2_ = *(char16 *)
                        &(pCVar10->super_LiteralString).super_JavascriptString.
                         super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject
                         ._vptr_IRecyclerVisitedObject;
        if (pchSrc._4_2_ == L'u') {
          cVar1 = pchLim[2];
          if ((ushort)(cVar1 + L'￐') < 10) {
            pchSrc._6_2_ = cVar1 << 0xc;
LAB_0108f486:
            pcVar9 = pchLim + 4;
            cVar1 = pchLim[3];
            uVar4 = cVar1 + L'￐';
            if (9 < uVar4) {
              pchSrc._4_2_ = cVar1 + L'﾿';
              if ((5 < (ushort)pchSrc._4_2_) &&
                 (pchSrc._4_2_ = cVar1 + L'ﾟ', 5 < (ushort)pchSrc._4_2_)) goto LAB_0108f5e5;
              uVar4 = pchSrc._4_2_ + L'\n';
            }
            pchSrc._6_2_ = pchSrc._6_2_ + uVar4 * 0x100;
            pchLim = pchLim + 5;
            pchSrc._4_2_ = *pcVar9;
            goto LAB_0108f513;
          }
          pchSrc._4_2_ = cVar1 + L'﾿';
          if (((ushort)pchSrc._4_2_ < 6) ||
             (pchSrc._4_2_ = cVar1 + L'ﾟ', (ushort)pchSrc._4_2_ < 6)) {
            pchSrc._6_2_ = (pchSrc._4_2_ + L'\n') * 0x1000;
            goto LAB_0108f486;
          }
LAB_0108f5e5:
          pchSrc._6_2_ = L'%';
          pchLim = (char16 *)pCVar10;
        }
        else {
          pchSrc._6_2_ = 0;
          pchLim = pchLim + 2;
LAB_0108f513:
          uVar4 = pchSrc._4_2_ + L'￐';
          if (9 < uVar4) {
            cVar1 = pchSrc._4_2_ + L'﾿';
            if ((5 < (ushort)(pchSrc._4_2_ + L'﾿')) &&
               (pchSrc._4_2_ = pchSrc._4_2_ + L'ﾟ', cVar1 = pchSrc._4_2_, 5 < (ushort)pchSrc._4_2_
               )) goto LAB_0108f5e5;
            pchSrc._4_2_ = cVar1;
            uVar4 = pchSrc._4_2_ + L'\n';
          }
          pchSrc._6_2_ = pchSrc._6_2_ + uVar4 * 0x10;
          cVar1 = *pchLim;
          pchSrc._4_2_ = cVar1 + L'￐';
          if ((ushort)pchSrc._4_2_ < 10) {
            pchSrc._6_2_ = pchSrc._6_2_ + pchSrc._4_2_;
            pchLim = pchLim + 1;
          }
          else {
            pchSrc._4_2_ = cVar1 + L'﾿';
            if ((5 < (ushort)pchSrc._4_2_) &&
               (pchSrc._4_2_ = cVar1 + L'ﾟ', 5 < (ushort)pchSrc._4_2_)) goto LAB_0108f5e5;
            pchSrc._6_2_ = pchSrc._6_2_ + pchSrc._4_2_ + L'\n';
            pchLim = pchLim + 1;
          }
        }
        bs = pCVar10;
        CompoundString::AppendChars((CompoundString *)src,pchSrc._6_2_);
      }
      else {
        pchLim = (char16 *)pCVar10;
        CompoundString::AppendChars((CompoundString *)src,pchSrc._4_2_);
      }
    }
    LeavePinnedScope();
    callInfo_local = (CallInfo)src;
  }
  return (Var)callInfo_local;
}

Assistant:

Var GlobalObject::EntryUnEscape(RecyclableObject* function, CallInfo callInfo, ...)
    {
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

        ARGUMENTS(args, callInfo);
        ScriptContext* scriptContext = function->GetScriptContext();

        Assert(!(callInfo.Flags & CallFlags_New));

        if (args.Info.Count <= 1)
        {
            return scriptContext->GetLibrary()->GetUndefinedDisplayString();
        }

        char16 chw;
        char16 chT;
        char16 * pchSrc;
        char16 * pchLim;
        char16 * pchMin;

        CompoundString * bs = nullptr;
        ENTER_PINNED_SCOPE(JavascriptString, src);
        src = JavascriptConversion::ToString(args[1], scriptContext);
        bs = CompoundString::NewWithCharCapacity(src->GetLength(), scriptContext->GetLibrary());
        pchSrc = const_cast<char16 *>(src->GetString());
        pchLim = pchSrc + src->GetLength();
        while (pchSrc < pchLim)
        {
            if ('%' != (chT = *pchSrc++))
            {
                bs->AppendChars(chT);
                continue;
            }

            pchMin = pchSrc;
            chT = *pchSrc++;
            if ('u' != chT)
            {
                chw = 0;
                goto LTwoHexDigits;
            }

            // 4 hex digits.
            if ((chT = *pchSrc++ - '0') <= 9)
                chw = chT * 0x1000;
            else if ((chT -= 'A' - '0') <= 5 || (chT -= 'a' - 'A') <= 5)
                chw = (chT + 10) * 0x1000;
            else
                goto LHexError;
            if ((chT = *pchSrc++ - '0') <= 9)
                chw += chT * 0x0100;
            else if ((chT -= 'A' - '0') <= 5 || (chT -= 'a' - 'A') <= 5)
                chw += (chT + 10) * 0x0100;
            else
                goto LHexError;
            chT = *pchSrc++;
LTwoHexDigits:
            if ((chT -= '0') <= 9)
                chw += chT * 0x0010;
            else if ((chT -= 'A' - '0') <= 5 || (chT -= 'a' - 'A') <= 5)
                chw += (chT + 10) * 0x0010;
            else
                goto LHexError;
            if ((chT = *pchSrc++ - '0') <= 9)
                chw += chT;
            else if ((chT -= 'A' - '0') <= 5 || (chT -= 'a' - 'A') <= 5)
                chw += chT + 10;
            else
            {
LHexError:
                pchSrc = pchMin;
                chw = '%';
            }

            bs->AppendChars(chw);
        }
        LEAVE_PINNED_SCOPE();   // src

        return bs;
    }